

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QFontEngine * __thiscall QFontPrivate::engineForScript(QFontPrivate *this,int script)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QFontCache *this_00;
  int in_ESI;
  QFontEngineData *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffffb8;
  QFontEngine *pQVar4;
  QFontEngine *in_stack_ffffffffffffffc0;
  int local_24;
  int script_00;
  QFontPrivate *d;
  
  d = *(QFontPrivate **)(in_FS_OFFSET + 0x28);
  script_00 = -0x55555556;
  qt_fontdatabase_mutex();
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_24 = in_ESI;
  if (in_ESI < 4) {
    local_24 = 2;
  }
  if (in_RDI->engines[0xd] != (QFontEngine *)0x0) {
    iVar1 = *(int *)((long)&in_RDI->engines[0xd]->_vptr_QFontEngine + 4);
    this_00 = QFontCache::instance();
    iVar3 = QFontCache::id(this_00);
    if (iVar1 != iVar3) {
      bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x710393);
      if ((!bVar2) &&
         (in_stack_ffffffffffffffc0 = in_RDI->engines[0xd],
         in_stack_ffffffffffffffc0 != (QFontEngine *)0x0)) {
        QFontEngineData::~QFontEngineData(in_RDI);
        operator_delete(in_stack_ffffffffffffffc0,0x568);
      }
      in_RDI->engines[0xd] = (QFontEngine *)0x0;
    }
  }
  if ((in_RDI->engines[0xd] == (QFontEngine *)0x0) ||
     (*(long *)(&in_RDI->engines[0xd]->m_type + (long)local_24 * 2) == 0)) {
    QFontDatabasePrivate::load(d,script_00);
  }
  pQVar4 = *(QFontEngine **)(&in_RDI->engines[0xd]->m_type + (long)local_24 * 2);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffffc0);
  if (*(QFontPrivate **)(in_FS_OFFSET + 0x28) != d) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QFontEngine *QFontPrivate::engineForScript(int script) const
{
    QMutexLocker locker(qt_fontdatabase_mutex());
    if (script <= QChar::Script_Latin)
        script = QChar::Script_Common;
    if (engineData && engineData->fontCacheId != QFontCache::instance()->id()) {
        // throw out engineData that came from a different thread
        if (!engineData->ref.deref())
            delete engineData;
        engineData = nullptr;
    }
    if (!engineData || !QT_FONT_ENGINE_FROM_DATA(engineData, script))
        QFontDatabasePrivate::load(this, script);
    return QT_FONT_ENGINE_FROM_DATA(engineData, script);
}